

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_70fba::OpenCorruptStore::check_database_open
          (OpenCorruptStore *this,error_code err)

{
  bool bVar1;
  AssertHelper local_1a0 [2];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190 [4];
  error_code local_16c;
  long *local_168;
  char *local_160;
  long local_158 [2];
  database local_148;
  
  pstore::get_error_category();
  local_158[0] = 0;
  local_158[1] = 0;
  local_160 = (char *)0x0;
  local_16c = err;
  local_168 = local_158;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pstore::database::database<pstore::file::in_memory>(&local_148,&(this->store_).file_,true);
    pstore::database::~database(&local_148);
  }
  std::__cxx11::string::_M_replace((ulong)&local_168,0,local_160,0x205ddb);
  testing::Message::Message((Message *)local_190);
  testing::internal::AssertHelper::AssertHelper
            (local_1a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_168);
  testing::internal::AssertHelper::operator=(local_1a0,(Message *)local_190);
  testing::internal::AssertHelper::~AssertHelper(local_1a0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_190[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_190[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  return;
}

Assistant:

void OpenCorruptStore::check_database_open (pstore::error_code err) const {
        check_for_error ([this] () { pstore::database{store_.file ()}; }, err);
    }